

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mconfig.cpp
# Opt level: O0

void test_save_and_load_with_inifile<int>(int userValue,QString *filepath)

{
  Format local_c4;
  undefined1 local_c0 [8];
  SimpleConfig<int> config2;
  Format local_64;
  undefined1 local_60 [8];
  SimpleConfig<int> config1;
  QString *filepath_local;
  int userValue_local;
  
  config1._64_8_ = filepath;
  SimpleConfig<int>::SimpleConfig((SimpleConfig<int> *)local_60);
  local_64 = IniFormat;
  config1.super_MConfig.mValues.d._0_4_ = userValue;
  MBaseConfig::save((MBaseConfig *)local_60,(QString *)config1._64_8_,&local_64);
  SimpleConfig<int>::SimpleConfig((SimpleConfig<int> *)local_c0);
  local_c4 = IniFormat;
  MBaseConfig::load((MBaseConfig *)local_c0,(QString *)config1._64_8_,&local_c4);
  QTest::qCompare((int)config1.super_MConfig.mValues.d,(int)config2.super_MConfig.mValues.d,
                  "config1.value","config2.value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/milosolutions[P]mconfig/tst_mconfig/tst_mconfig.cpp"
                  ,0x6f);
  SimpleConfig<int>::~SimpleConfig((SimpleConfig<int> *)local_c0);
  SimpleConfig<int>::~SimpleConfig((SimpleConfig<int> *)local_60);
  return;
}

Assistant:

void test_save_and_load_with_inifile(T userValue, const QString& filepath)
{
    SimpleConfig<T> config1;
    config1.value = userValue;
    config1.save(filepath);
    SimpleConfig<T> config2;
    config2.load(filepath);
    QCOMPARE(config1.value, config2.value);
}